

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypeFileInput.cpp
# Opt level: O1

void __thiscall OpenTypeFileInput::OpenTypeFileInput(OpenTypeFileInput *this)

{
  _Rb_tree_header *p_Var1;
  
  CFFFileInput::CFFFileInput(&this->mCFF);
  OpenTypePrimitiveReader::OpenTypePrimitiveReader
            (&this->mPrimitivesReader,(IByteReaderWithPosition *)0x0);
  p_Var1 = &(this->mTables)._M_t._M_impl.super__Rb_tree_header;
  (this->mTables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mTables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mTables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mTables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mTables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mActualGlyphs)._M_t._M_impl.super__Rb_tree_header;
  (this->mActualGlyphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mActualGlyphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mActualGlyphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mActualGlyphs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mActualGlyphs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mHMtx = (HMtxTable)0x0;
  this->mHeaderOffset = 0;
  this->mTableOffset = 0;
  (this->mName).mNameEntries = (NameTableEntry *)0x0;
  this->mLoca = (LocaTable)0x0;
  this->mGlyf = (GlyfTable)0x0;
  return;
}

Assistant:

OpenTypeFileInput::OpenTypeFileInput(void)
{
    mHeaderOffset = 0;
    mTableOffset = 0;
	mHMtx = NULL;
	mName.mNameEntries = NULL;
	mLoca = NULL;
	mGlyf = NULL;
}